

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int memjrnlClose(sqlite3_file *pJfd)

{
  memjrnlFreeChunks((MemJournal *)pJfd);
  return 0;
}

Assistant:

static int memjrnlClose(sqlite3_file *pJfd){
  MemJournal *p = (MemJournal *)pJfd;
  memjrnlFreeChunks(p);
  return SQLITE_OK;
}